

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::StreamingConcatenationExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (StreamingConcatenationExpression *this,SampledValueExprVisitor *visitor)

{
  Expression *this_00;
  StreamExpression *stream;
  pointer this_01;
  long lVar1;
  
  this_01 = (this->streams_).data_;
  for (lVar1 = (this->streams_).size_ * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    this_00 = not_null<const_slang::ast::Expression_*>::get(&this_01->operand);
    Expression::visit<slang::ast::SampledValueExprVisitor&>(this_00,visitor);
    if (this_01->withExpr != (Expression *)0x0) {
      Expression::visit<slang::ast::SampledValueExprVisitor&>(this_01->withExpr,visitor);
    }
    this_01 = this_01 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& stream : streams()) {
            stream.operand->visit(visitor);
            if (stream.withExpr)
                stream.withExpr->visit(visitor);
        }
    }